

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O2

bool TestConstExpr::NotEqualTest<long,unsigned_long_long>(void)

{
  int local_c;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  local_c = 7;
  SafeInt<unsigned_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<int>
            (&local_8,&local_c);
  return false;
}

Assistant:

SAFEINT_CONSTEXPR11 bool NotEqualTest()
	{
		return
			(U)2 != SafeInt<T>(3) &&
			SafeInt<T>(4) != (U)5 &&
			SafeInt<T>(6) != SafeInt<U>(7) &&
			true != SafeInt<T>(1) &&
			false != SafeInt<T>(0);
	}